

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_2_3_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  float *data;
  ulong uVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  float *pfVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  float *pfVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  int k_count;
  int iVar47;
  long lVar48;
  int iVar49;
  float *pfVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  float fVar64;
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  undefined1 auVar81 [16];
  float fVar82;
  undefined1 auVar83 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  int data_width;
  float *local_100;
  
  auVar58._8_4_ = 0x80000000;
  auVar58._0_8_ = 0x8000000080000000;
  auVar58._12_4_ = 0x80000000;
  auVar59._8_4_ = 0x3effffff;
  auVar59._0_8_ = 0x3effffff3effffff;
  auVar59._12_4_ = 0x3effffff;
  fVar65 = ipoint->scale;
  auVar86 = ZEXT464((uint)fVar65);
  auVar51 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)fVar65),auVar58,0xf8);
  auVar51 = ZEXT416((uint)(fVar65 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  iVar31 = (int)auVar51._0_4_;
  fVar64 = -0.08 / (fVar65 * fVar65);
  auVar52 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)ipoint->x),auVar58,0xf8);
  auVar52 = ZEXT416((uint)(ipoint->x + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53._0_8_ = (double)auVar52._0_4_;
  auVar53._8_8_ = auVar52._8_8_;
  auVar57._0_8_ = (double)fVar65;
  auVar57._8_8_ = 0;
  auVar52 = vfmadd231sd_fma(auVar53,auVar57,ZEXT816(0x3fe0000000000000));
  auVar56._0_4_ = (float)auVar52._0_8_;
  auVar56._4_12_ = auVar52._4_12_;
  auVar52 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)ipoint->y),auVar58,0xf8);
  auVar52 = ZEXT416((uint)(ipoint->y + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar54._0_8_ = (double)auVar52._0_4_;
  auVar54._8_8_ = auVar52._8_8_;
  auVar52 = vfmadd231sd_fma(auVar54,auVar57,ZEXT816(0x3fe0000000000000));
  auVar55._0_4_ = (float)auVar52._0_8_;
  auVar55._4_12_ = auVar52._4_12_;
  auVar52._0_4_ = (int)auVar51._0_4_;
  auVar52._4_4_ = (int)auVar51._4_4_;
  auVar52._8_4_ = (int)auVar51._8_4_;
  auVar52._12_4_ = (int)auVar51._12_4_;
  auVar51 = vcvtdq2ps_avx(auVar52);
  fVar3 = auVar56._0_4_ - auVar51._0_4_;
  fVar4 = auVar55._0_4_ - auVar51._0_4_;
  auVar51 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar65),auVar56);
  auVar52 = vpternlogd_avx512vl(auVar59,auVar51,auVar58,0xf8);
  auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar52._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = ZEXT416((uint)fVar65);
  if (iVar31 < (int)auVar51._0_4_) {
    auVar51 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar52,auVar55);
    auVar60._8_4_ = 0x3effffff;
    auVar60._0_8_ = 0x3effffff3effffff;
    auVar60._12_4_ = 0x3effffff;
    auVar61._8_4_ = 0x80000000;
    auVar61._0_8_ = 0x8000000080000000;
    auVar61._12_4_ = 0x80000000;
    auVar53 = vpternlogd_avx512vl(auVar61,auVar51,auVar60,0xea);
    auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar53._0_4_));
    auVar51 = vroundss_avx(auVar51,auVar51,0xb);
    if (iVar31 < (int)auVar51._0_4_) {
      auVar51 = vfmadd231ss_fma(auVar56,auVar52,ZEXT416(0x41300000));
      auVar62._8_4_ = 0x80000000;
      auVar62._0_8_ = 0x8000000080000000;
      auVar62._12_4_ = 0x80000000;
      auVar53 = vpternlogd_avx512vl(auVar62,auVar51,auVar60,0xea);
      auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar53._0_4_));
      auVar51 = vroundss_avx(auVar51,auVar51,0xb);
      if ((int)auVar51._0_4_ + iVar31 <= iimage->width) {
        auVar51 = vfmadd231ss_fma(auVar55,auVar52,ZEXT416(0x41300000));
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar53 = vpternlogd_avx512vl(auVar60,auVar51,auVar14,0xf8);
        auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar53._0_4_));
        auVar51 = vroundss_avx(auVar51,auVar51,0xb);
        if ((int)auVar51._0_4_ + iVar31 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          pfVar39 = iimage->data;
          iVar1 = iimage->data_width;
          iVar47 = iVar31 * 2;
          local_100 = haarResponseY + 0x1a;
          pfVar50 = haarResponseX + 0x1a;
          uVar20 = 0xfffffff4;
          do {
            auVar51._0_4_ = (float)(int)uVar20;
            auVar83 = in_ZMM8._4_12_;
            auVar51._4_12_ = auVar83;
            auVar51 = vfmadd213ss_fma(auVar51,auVar52,ZEXT416((uint)(fVar4 + 0.5)));
            iVar16 = (int)auVar51._0_4_;
            auVar75._0_4_ = (float)(int)(uVar20 | 1);
            auVar75._4_12_ = auVar83;
            auVar51 = vfmadd213ss_fma(auVar75,auVar52,ZEXT416((uint)(fVar4 + 0.5)));
            iVar24 = (int)auVar51._0_4_;
            iVar23 = (iVar16 + -1) * iVar1;
            iVar25 = (iVar16 + -1 + iVar31) * iVar1;
            iVar27 = (iVar16 + -1 + iVar47) * iVar1;
            iVar16 = (iVar24 + -1) * iVar1;
            iVar26 = (iVar24 + -1 + iVar31) * iVar1;
            iVar24 = (iVar24 + -1 + iVar47) * iVar1;
            lVar45 = 0;
            do {
              iVar28 = (int)lVar45;
              auVar76._0_4_ = (float)(iVar28 + -0xc);
              auVar76._4_12_ = auVar83;
              auVar51 = vfmadd213ss_fma(auVar76,auVar52,ZEXT416((uint)fVar3));
              iVar18 = (int)auVar51._0_4_;
              auVar77._0_4_ = (float)(iVar28 + -0xb);
              auVar77._4_12_ = auVar59._4_12_;
              auVar51 = vfmadd213ss_fma(auVar77,auVar52,ZEXT416((uint)fVar3));
              iVar35 = (int)auVar51._0_4_;
              auVar78._0_4_ = (float)(iVar28 + -10);
              auVar78._4_12_ = auVar59._4_12_;
              auVar51 = vfmadd213ss_fma(auVar78,auVar52,ZEXT416((uint)fVar3));
              iVar49 = (int)auVar51._0_4_;
              iVar32 = iVar18 + -1 + iVar31;
              iVar34 = iVar18 + -1 + iVar47;
              fVar65 = pfVar39[iVar25 + -1 + iVar18];
              fVar70 = pfVar39[iVar27 + -1 + iVar18];
              fVar80 = pfVar39[iVar27 + iVar34];
              fVar5 = pfVar39[iVar23 + -1 + iVar18];
              fVar6 = pfVar39[iVar23 + iVar34];
              auVar53 = SUB6416(ZEXT464(0x40000000),0);
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar23 + iVar32] -
                                                      pfVar39[iVar27 + iVar32])),auVar53,
                                        ZEXT416((uint)(fVar80 - fVar5)));
              fVar71 = pfVar39[iVar25 + iVar34];
              pfVar50[lVar45 + -0x1a] = (fVar70 - fVar6) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar71)),auVar53,
                                        ZEXT416((uint)(fVar80 - fVar5)));
              iVar19 = iVar35 + -1 + iVar31;
              local_100[lVar45 + -0x1a] = auVar51._0_4_ - (fVar70 - fVar6);
              iVar36 = iVar35 + -1 + iVar47;
              fVar65 = pfVar39[iVar25 + -1 + iVar35];
              fVar70 = pfVar39[iVar27 + -1 + iVar35];
              fVar80 = pfVar39[iVar27 + iVar36];
              fVar5 = pfVar39[iVar23 + -1 + iVar35];
              fVar6 = pfVar39[iVar23 + iVar36];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar23 + iVar19] -
                                                      pfVar39[iVar27 + iVar19])),auVar53,
                                        ZEXT416((uint)(fVar80 - fVar5)));
              fVar71 = pfVar39[iVar25 + iVar36];
              pfVar50[lVar45 + -0x19] = (fVar70 - fVar6) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar71)),auVar53,
                                        ZEXT416((uint)(fVar80 - fVar5)));
              local_100[lVar45 + -0x19] = auVar51._0_4_ - (fVar70 - fVar6);
              iVar17 = iVar49 + -1 + iVar31;
              iVar42 = iVar49 + -1 + iVar47;
              fVar65 = pfVar39[iVar25 + -1 + iVar49];
              fVar70 = pfVar39[iVar27 + -1 + iVar49];
              fVar80 = pfVar39[iVar27 + iVar42];
              fVar5 = pfVar39[iVar23 + -1 + iVar49];
              fVar6 = pfVar39[iVar23 + iVar42];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar23 + iVar17] -
                                                      pfVar39[iVar27 + iVar17])),auVar53,
                                        ZEXT416((uint)(fVar80 - fVar5)));
              fVar71 = pfVar39[iVar25 + iVar42];
              pfVar50[lVar45 + -0x18] = (fVar70 - fVar6) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar71)),auVar53,
                                        ZEXT416((uint)(fVar80 - fVar5)));
              local_100[lVar45 + -0x18] = auVar51._0_4_ - (fVar70 - fVar6);
              fVar65 = pfVar39[iVar26 + -1 + iVar18];
              fVar70 = pfVar39[iVar24 + -1 + iVar18];
              fVar80 = pfVar39[iVar34 + iVar24];
              fVar5 = pfVar39[iVar16 + -1 + iVar18];
              fVar6 = pfVar39[iVar16 + iVar34];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar16 + iVar32] -
                                                      pfVar39[iVar32 + iVar24])),auVar53,
                                        ZEXT416((uint)(fVar80 - fVar5)));
              fVar71 = pfVar39[iVar26 + iVar34];
              pfVar50[lVar45 + -2] = (fVar70 - fVar6) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar71)),auVar53,
                                        ZEXT416((uint)(fVar80 - fVar5)));
              local_100[lVar45 + -2] = auVar51._0_4_ - (fVar70 - fVar6);
              fVar65 = pfVar39[iVar26 + -1 + iVar35];
              fVar70 = pfVar39[iVar24 + -1 + iVar35];
              fVar80 = pfVar39[iVar36 + iVar24];
              fVar5 = pfVar39[iVar16 + -1 + iVar35];
              fVar6 = pfVar39[iVar16 + iVar36];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar16 + iVar19] -
                                                      pfVar39[iVar19 + iVar24])),auVar53,
                                        ZEXT416((uint)(fVar80 - fVar5)));
              fVar71 = pfVar39[iVar26 + iVar36];
              pfVar50[lVar45 + -1] = (fVar70 - fVar6) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar71)),auVar53,
                                        ZEXT416((uint)(fVar80 - fVar5)));
              local_100[lVar45 + -1] = auVar51._0_4_ - (fVar70 - fVar6);
              fVar65 = pfVar39[iVar26 + -1 + iVar49];
              fVar70 = pfVar39[iVar24 + -1 + iVar49];
              fVar80 = pfVar39[iVar42 + iVar24];
              fVar5 = pfVar39[iVar16 + -1 + iVar49];
              fVar6 = pfVar39[iVar16 + iVar42];
              fVar71 = pfVar39[iVar26 + iVar42];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar16 + iVar17] -
                                                      pfVar39[iVar17 + iVar24])),auVar53,
                                        ZEXT416((uint)(fVar80 - fVar5)));
              pfVar50[lVar45] = (fVar70 - fVar6) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar71)),auVar53,
                                        ZEXT416((uint)(fVar80 - fVar5)));
              local_100[lVar45] = auVar51._0_4_ - (fVar70 - fVar6);
              lVar45 = lVar45 + 3;
            } while (iVar28 + -0xc < 9);
            local_100 = local_100 + 0x30;
            pfVar50 = pfVar50 + 0x30;
            bVar2 = (int)uVar20 < 10;
            uVar20 = uVar20 + 2;
          } while (bVar2);
          goto LAB_001bd349;
        }
      }
    }
  }
  iVar1 = iVar31 * 2;
  lVar45 = 0;
  uVar20 = 0xfffffff4;
  do {
    auVar66._0_4_ = (float)(int)uVar20;
    auVar66._4_12_ = in_ZMM8._4_12_;
    auVar68._0_4_ = (float)(int)(uVar20 | 1);
    auVar68._4_12_ = in_ZMM8._4_12_;
    auVar51 = vfmadd213ss_fma(auVar66,auVar86._0_16_,ZEXT416((uint)fVar4));
    auVar53 = vfmadd213ss_fma(auVar68,auVar86._0_16_,ZEXT416((uint)fVar4));
    fVar65 = auVar51._0_4_;
    iVar49 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
    fVar65 = auVar53._0_4_;
    iVar16 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
    iVar23 = iVar1 + iVar49;
    iVar24 = iVar49 + -1;
    iVar25 = iVar49 + -1 + iVar31;
    iVar26 = iVar1 + iVar16;
    iVar27 = iVar16 + -1;
    iVar28 = iVar16 + -1 + iVar31;
    lVar44 = lVar45;
    iVar47 = -0xc;
    do {
      auVar67._0_4_ = (float)iVar47;
      auVar83 = in_ZMM8._4_12_;
      auVar67._4_12_ = auVar83;
      auVar54 = auVar86._0_16_;
      auVar51 = vfmadd213ss_fma(auVar67,auVar54,ZEXT416((uint)fVar3));
      auVar81._0_4_ = (float)(iVar47 + 1);
      auVar81._4_12_ = auVar83;
      auVar53 = vfmadd213ss_fma(auVar81,auVar54,ZEXT416((uint)fVar3));
      fVar80 = auVar53._0_4_;
      auVar72._0_4_ = (float)(iVar47 + 2);
      auVar72._4_12_ = auVar83;
      auVar53 = vfmadd213ss_fma(auVar72,auVar54,ZEXT416((uint)fVar3));
      fVar65 = auVar51._0_4_;
      fVar70 = auVar53._0_4_;
      pfVar39 = (float *)((long)haarResponseY + lVar44);
      iVar32 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
      if ((((iVar49 < 1) || (iVar32 < 1)) || (iimage->height < iVar23)) ||
         (iVar17 = iVar1 + iVar32, iimage->width < iVar17)) {
        haarXY(iimage,iVar49,iVar32,iVar31,(float *)((long)haarResponseX + lVar44),pfVar39);
      }
      else {
        iVar34 = iVar32 + -1 + iVar31;
        pfVar50 = iimage->data;
        iVar18 = iimage->data_width;
        iVar19 = iVar18 * iVar24;
        fVar65 = pfVar50[iVar18 * iVar25 + -1 + iVar32];
        iVar36 = iVar18 * (iVar1 + -1 + iVar49);
        fVar5 = pfVar50[iVar36 + -1 + iVar32];
        fVar6 = pfVar50[iVar36 + -1 + iVar17];
        fVar71 = pfVar50[iVar19 + -1 + iVar32];
        fVar7 = pfVar50[iVar19 + -1 + iVar17];
        fVar8 = pfVar50[iVar18 * iVar25 + -1 + iVar17];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar19 + iVar34] - pfVar50[iVar36 + iVar34]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar71)));
        *(float *)((long)haarResponseX + lVar44) = (fVar5 - fVar7) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar71)));
        *pfVar39 = auVar51._0_4_ - (fVar5 - fVar7);
      }
      iVar17 = (int)((double)((ulong)(0.0 <= fVar80) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar80) * -0x4020000000000000) + (double)fVar80);
      pfVar39 = (float *)((long)haarResponseX + lVar44 + 4);
      pfVar50 = (float *)((long)haarResponseY + lVar44 + 4);
      if (((iVar49 < 1) || (iVar17 < 1)) ||
         ((iimage->height < iVar23 || (iVar18 = iVar1 + iVar17, iimage->width < iVar18)))) {
        haarXY(iimage,iVar49,iVar17,iVar31,pfVar39,pfVar50);
      }
      else {
        iVar36 = iVar17 + -1 + iVar31;
        pfVar43 = iimage->data;
        iVar19 = iimage->data_width;
        iVar34 = iVar19 * iVar24;
        fVar65 = pfVar43[iVar19 * iVar25 + -1 + iVar17];
        iVar35 = iVar19 * (iVar1 + -1 + iVar49);
        fVar80 = pfVar43[iVar35 + -1 + iVar17];
        fVar5 = pfVar43[iVar35 + -1 + iVar18];
        fVar6 = pfVar43[iVar34 + -1 + iVar17];
        fVar71 = pfVar43[iVar34 + -1 + iVar18];
        fVar7 = pfVar43[iVar19 * iVar25 + -1 + iVar18];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar34 + iVar36] - pfVar43[iVar35 + iVar36]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar39 = (fVar80 - fVar71) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar50 = auVar51._0_4_ - (fVar80 - fVar71);
      }
      iVar18 = (int)((double)((ulong)(0.0 <= fVar70) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar70) * -0x4020000000000000) + (double)fVar70);
      pfVar39 = (float *)((long)haarResponseX + lVar44 + 8);
      pfVar50 = (float *)((long)haarResponseY + lVar44 + 8);
      if (((iVar49 < 1) || (iVar18 < 1)) ||
         ((iimage->height < iVar23 || (iVar19 = iVar1 + iVar18, iimage->width < iVar19)))) {
        haarXY(iimage,iVar49,iVar18,iVar31,pfVar39,pfVar50);
      }
      else {
        iVar35 = iVar18 + -1 + iVar31;
        pfVar43 = iimage->data;
        iVar34 = iimage->data_width;
        iVar36 = iVar34 * iVar24;
        fVar65 = pfVar43[iVar34 * iVar25 + -1 + iVar18];
        iVar42 = iVar34 * (iVar1 + -1 + iVar49);
        fVar70 = pfVar43[iVar42 + -1 + iVar18];
        fVar80 = pfVar43[iVar42 + -1 + iVar19];
        fVar5 = pfVar43[iVar36 + -1 + iVar18];
        fVar6 = pfVar43[iVar36 + -1 + iVar19];
        fVar71 = pfVar43[iVar34 * iVar25 + -1 + iVar19];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar36 + iVar35] - pfVar43[iVar42 + iVar35]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar5)));
        *pfVar39 = (fVar70 - fVar6) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar71)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar5)));
        *pfVar50 = auVar51._0_4_ - (fVar70 - fVar6);
      }
      pfVar39 = (float *)((long)haarResponseX + lVar44 + 0x60);
      pfVar50 = (float *)((long)haarResponseY + lVar44 + 0x60);
      if ((((iVar16 < 1) || (iVar32 < 1)) || (iimage->height < iVar26)) ||
         (iVar19 = iVar1 + iVar32, iimage->width < iVar19)) {
        haarXY(iimage,iVar16,iVar32,iVar31,pfVar39,pfVar50);
      }
      else {
        iVar42 = iVar32 + -1 + iVar31;
        pfVar43 = iimage->data;
        iVar34 = iimage->data_width;
        iVar35 = iVar34 * iVar27;
        fVar65 = pfVar43[iVar34 * iVar28 + -1 + iVar32];
        iVar36 = iVar34 * (iVar1 + -1 + iVar16);
        fVar70 = pfVar43[iVar36 + -1 + iVar32];
        fVar80 = pfVar43[iVar36 + -1 + iVar19];
        fVar5 = pfVar43[iVar35 + -1 + iVar32];
        fVar6 = pfVar43[iVar35 + -1 + iVar19];
        fVar71 = pfVar43[iVar34 * iVar28 + -1 + iVar19];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar35 + iVar42] - pfVar43[iVar36 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar5)));
        *pfVar39 = (fVar70 - fVar6) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar71)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar5)));
        *pfVar50 = auVar51._0_4_ - (fVar70 - fVar6);
      }
      pfVar39 = (float *)((long)haarResponseX + lVar44 + 100);
      pfVar50 = (float *)((long)haarResponseY + lVar44 + 100);
      if (((iVar16 < 1) || (iVar17 < 1)) ||
         ((iimage->height < iVar26 || (iVar32 = iVar1 + iVar17, iimage->width < iVar32)))) {
        haarXY(iimage,iVar16,iVar17,iVar31,pfVar39,pfVar50);
      }
      else {
        iVar34 = iVar17 + -1 + iVar31;
        pfVar43 = iimage->data;
        iVar19 = iimage->data_width;
        iVar35 = iVar19 * iVar27;
        fVar65 = pfVar43[iVar19 * iVar28 + -1 + iVar17];
        iVar36 = iVar19 * (iVar1 + -1 + iVar16);
        fVar70 = pfVar43[iVar36 + -1 + iVar17];
        fVar80 = pfVar43[iVar36 + -1 + iVar32];
        fVar5 = pfVar43[iVar35 + -1 + iVar17];
        fVar6 = pfVar43[iVar35 + -1 + iVar32];
        fVar71 = pfVar43[iVar19 * iVar28 + -1 + iVar32];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar35 + iVar34] - pfVar43[iVar36 + iVar34]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar5)));
        *pfVar39 = (fVar70 - fVar6) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar71)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar5)));
        *pfVar50 = auVar51._0_4_ - (fVar70 - fVar6);
      }
      pfVar39 = (float *)((long)haarResponseX + lVar44 + 0x68);
      pfVar50 = (float *)((long)haarResponseY + lVar44 + 0x68);
      if (((iVar16 < 1) || (iVar18 < 1)) ||
         ((iimage->height < iVar26 || (iVar32 = iVar1 + iVar18, iimage->width < iVar32)))) {
        haarXY(iimage,iVar16,iVar18,iVar31,pfVar39,pfVar50);
      }
      else {
        iVar19 = iVar18 + -1 + iVar31;
        pfVar43 = iimage->data;
        iVar17 = iimage->data_width;
        iVar36 = iVar17 * iVar27;
        fVar65 = pfVar43[iVar17 * iVar28 + -1 + iVar18];
        iVar34 = iVar17 * (iVar1 + -1 + iVar16);
        fVar70 = pfVar43[iVar34 + -1 + iVar18];
        fVar80 = pfVar43[iVar34 + -1 + iVar32];
        fVar5 = pfVar43[iVar36 + -1 + iVar18];
        fVar6 = pfVar43[iVar36 + -1 + iVar32];
        fVar71 = pfVar43[iVar17 * iVar28 + -1 + iVar32];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar43[iVar36 + iVar19] - pfVar43[iVar34 + iVar19]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar5)));
        *pfVar39 = (fVar70 - fVar6) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar71)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar80 - fVar5)));
        *pfVar50 = auVar51._0_4_ - (fVar70 - fVar6);
      }
      auVar86 = ZEXT1664(auVar52);
      lVar44 = lVar44 + 0xc;
      bVar2 = iVar47 < 9;
      iVar47 = iVar47 + 3;
    } while (bVar2);
    lVar45 = lVar45 + 0xc0;
    bVar2 = (int)uVar20 < 10;
    uVar20 = uVar20 + 2;
  } while (bVar2);
LAB_001bd349:
  fVar65 = auVar86._0_4_;
  auVar85._8_4_ = 0x3effffff;
  auVar85._0_8_ = 0x3effffff3effffff;
  auVar85._12_4_ = 0x3effffff;
  auVar84._8_4_ = 0x80000000;
  auVar84._0_8_ = 0x8000000080000000;
  auVar84._12_4_ = 0x80000000;
  auVar51 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar65 * 0.5)),auVar84,0xf8);
  auVar51 = ZEXT416((uint)(fVar65 * 0.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar65 * 1.5)),auVar84,0xf8);
  auVar52 = ZEXT416((uint)(fVar65 * 1.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar65 * 2.5)),auVar84,0xf8);
  auVar53 = ZEXT416((uint)(fVar65 * 2.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar65 * 3.5)),auVar84,0xf8);
  auVar54 = ZEXT416((uint)(fVar65 * 3.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar65 * 4.5)),auVar84,0xf8);
  auVar55 = ZEXT416((uint)(fVar65 * 4.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar65 * 5.5)),auVar84,0xf8);
  auVar56 = ZEXT416((uint)(fVar65 * 5.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar65 * 6.5)),auVar84,0xf8);
  auVar57 = ZEXT416((uint)(fVar65 * 6.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar65 * 7.5)),auVar84,0xf8);
  auVar58 = ZEXT416((uint)(auVar58._0_4_ + fVar65 * 7.5));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar65 * 8.5)),auVar84,0xf8);
  auVar59 = ZEXT416((uint)(fVar65 * 8.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar65 * 9.5)),auVar84,0xf8);
  auVar60 = ZEXT416((uint)(fVar65 * 9.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar65 * 10.5)),auVar84,0xf8);
  auVar61 = ZEXT416((uint)(fVar65 * 10.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar65 * 11.5)),auVar84,0xf8);
  auVar62 = ZEXT416((uint)(fVar65 * 11.5 + auVar62._0_4_));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  fVar71 = auVar53._0_4_;
  fVar65 = fVar71 + auVar52._0_4_;
  fVar3 = fVar71 + auVar51._0_4_;
  fVar4 = fVar71 - auVar51._0_4_;
  fVar70 = fVar71 - auVar52._0_4_;
  fVar80 = fVar71 - auVar54._0_4_;
  fVar5 = fVar71 - auVar55._0_4_;
  fVar6 = fVar71 - auVar56._0_4_;
  fVar71 = fVar71 - auVar57._0_4_;
  fVar82 = auVar58._0_4_;
  fVar7 = fVar82 - auVar54._0_4_;
  fVar8 = fVar82 - auVar55._0_4_;
  fVar9 = fVar82 - auVar56._0_4_;
  fVar10 = fVar82 - auVar57._0_4_;
  fVar11 = fVar82 - auVar59._0_4_;
  fVar12 = fVar82 - auVar60._0_4_;
  fVar13 = fVar82 - auVar61._0_4_;
  fVar82 = fVar82 - auVar62._0_4_;
  gauss_s1_c0[0] = expf(fVar65 * fVar65 * fVar64);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar64);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar64);
  gauss_s1_c0[3] = expf(fVar70 * fVar70 * fVar64);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar80 * fVar80 * fVar64);
  gauss_s1_c0[6] = expf(fVar5 * fVar5 * fVar64);
  gauss_s1_c0[7] = expf(fVar6 * fVar6 * fVar64);
  gauss_s1_c0[8] = expf(fVar71 * fVar71 * fVar64);
  gauss_s1_c1[0] = expf(fVar7 * fVar7 * fVar64);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar64);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar64);
  gauss_s1_c1[3] = expf(fVar10 * fVar10 * fVar64);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar11 * fVar11 * fVar64);
  gauss_s1_c1[6] = expf(fVar12 * fVar12 * fVar64);
  gauss_s1_c1[7] = expf(fVar13 * fVar13 * fVar64);
  gauss_s1_c1[8] = expf(fVar82 * fVar82 * fVar64);
  uVar21 = 0xfffffff8;
  lVar45 = 0;
  fVar65 = 0.0;
  auVar69._8_4_ = 0x7fffffff;
  auVar69._0_8_ = 0x7fffffff7fffffff;
  auVar69._12_4_ = 0x7fffffff;
  lVar44 = 0;
  lVar40 = 0;
  do {
    pfVar39 = gauss_s1_c1;
    uVar20 = (uint)uVar21;
    if (uVar20 != 7) {
      pfVar39 = gauss_s1_c0;
    }
    if (uVar20 == 0xfffffff8) {
      pfVar39 = gauss_s1_c1;
    }
    lVar44 = (long)(int)lVar44;
    iVar31 = (int)lVar40;
    lVar40 = (long)iVar31;
    lVar38 = (long)haarResponseX + lVar45;
    lVar30 = (long)haarResponseY + lVar45;
    uVar37 = 0xfffffff8;
    uVar33 = 0;
    do {
      pfVar50 = gauss_s1_c1;
      if (uVar37 != 7) {
        pfVar50 = gauss_s1_c0;
      }
      if (uVar37 == 0xfffffff8) {
        pfVar50 = gauss_s1_c1;
      }
      uVar22 = (ulong)(uVar37 >> 0x1c & 0xfffffff8);
      auVar86 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar29 = uVar33;
      lVar46 = lVar38;
      lVar48 = lVar30;
      do {
        lVar41 = 0;
        pfVar43 = (float *)((long)pfVar39 + (ulong)(uint)((int)(uVar21 >> 0x1f) << 5));
        do {
          fVar3 = pfVar50[uVar22] * *pfVar43;
          auVar51 = vinsertps_avx(ZEXT416(*(uint *)(lVar48 + lVar41 * 4)),
                                  ZEXT416(*(uint *)(lVar46 + lVar41 * 4)),0x10);
          auVar79._0_4_ = fVar3 * auVar51._0_4_;
          auVar79._4_4_ = fVar3 * auVar51._4_4_;
          auVar79._8_4_ = fVar3 * auVar51._8_4_;
          auVar79._12_4_ = fVar3 * auVar51._12_4_;
          auVar51 = vandps_avx(auVar79,auVar69);
          auVar51 = vmovlhps_avx(auVar79,auVar51);
          auVar73._0_4_ = auVar86._0_4_ + auVar51._0_4_;
          auVar73._4_4_ = auVar86._4_4_ + auVar51._4_4_;
          auVar73._8_4_ = auVar86._8_4_ + auVar51._8_4_;
          auVar73._12_4_ = auVar86._12_4_ + auVar51._12_4_;
          auVar86 = ZEXT1664(auVar73);
          pfVar43 = pfVar43 + (ulong)(~uVar20 >> 0x1f) * 2 + -1;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 9);
        uVar29 = uVar29 + 0x18;
        uVar22 = uVar22 + (ulong)(-1 < (int)uVar37) * 2 + -1;
        lVar46 = lVar46 + 0x60;
        lVar48 = lVar48 + 0x60;
      } while (uVar29 < uVar37 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar40];
      auVar15._4_4_ = fVar3;
      auVar15._0_4_ = fVar3;
      auVar15._8_4_ = fVar3;
      auVar15._12_4_ = fVar3;
      auVar53 = vmulps_avx512vl(auVar73,auVar15);
      lVar40 = lVar40 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar44) = auVar53;
      auVar74._0_4_ = auVar53._0_4_ * auVar53._0_4_;
      auVar74._4_4_ = auVar53._4_4_ * auVar53._4_4_;
      auVar74._8_4_ = auVar53._8_4_ * auVar53._8_4_;
      auVar74._12_4_ = auVar53._12_4_ * auVar53._12_4_;
      auVar51 = vmovshdup_avx(auVar74);
      auVar52 = vfmadd231ss_fma(auVar51,auVar53,auVar53);
      auVar51 = vshufpd_avx(auVar53,auVar53,1);
      auVar52 = vfmadd213ss_fma(auVar51,auVar51,auVar52);
      auVar51 = vshufps_avx(auVar53,auVar53,0xff);
      auVar51 = vfmadd213ss_fma(auVar51,auVar51,auVar52);
      fVar65 = fVar65 + auVar51._0_4_;
      lVar44 = lVar44 + 4;
      uVar37 = uVar37 + 5;
      uVar33 = uVar33 + 0x78;
      lVar38 = lVar38 + 0x1e0;
      lVar30 = lVar30 + 0x1e0;
    } while (iVar31 + 4 != (int)lVar40);
    lVar45 = lVar45 + 0x14;
    uVar21 = (ulong)(uVar20 + 5);
  } while ((int)uVar20 < 3);
  if (fVar65 < 0.0) {
    fVar65 = sqrtf(fVar65);
  }
  else {
    auVar51 = vsqrtss_avx(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65));
    fVar65 = auVar51._0_4_;
  }
  auVar86 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar65)));
  lVar45 = 0;
  do {
    auVar63 = vmulps_avx512f(auVar86,*(undefined1 (*) [64])(ipoint->descriptor + lVar45));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar45) = auVar63;
    lVar45 = lVar45 + 0x10;
  } while (lVar45 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_3_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}